

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_arrowhead.cpp
# Opt level: O0

uint __thiscall agg::arrowhead::vertex(arrowhead *this,double *x,double *y)

{
  uint uVar1;
  uint curr_idx;
  double *y_local;
  double *x_local;
  arrowhead *this_local;
  
  if (this->m_curr_id < 2) {
    uVar1 = this->m_curr_coord * 2;
    *x = this->m_coord[uVar1];
    *y = this->m_coord[uVar1 + 1];
    uVar1 = this->m_curr_coord;
    this->m_curr_coord = uVar1 + 1;
    this_local._4_4_ = this->m_cmd[uVar1];
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned arrowhead::vertex(double* x, double* y)
    {
        if(m_curr_id < 2)
        {
            unsigned curr_idx = m_curr_coord * 2;
            *x = m_coord[curr_idx];
            *y = m_coord[curr_idx + 1];
            return m_cmd[m_curr_coord++];
        }
        return path_cmd_stop;
    }